

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O0

void nn_priolist_advance(nn_priolist *self,int release)

{
  int iVar1;
  nn_list_item *pnVar2;
  int in_ESI;
  long in_RDI;
  nn_list_item *it;
  nn_priolist_slot *slot;
  nn_list_item *in_stack_ffffffffffffffd8;
  nn_list *in_stack_ffffffffffffffe0;
  nn_list *local_18;
  
  if (*(int *)(in_RDI + 0x180) < 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->current > 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/utils/priolist.c"
            ,0x9a);
    fflush(_stderr);
    nn_err_abort();
  }
  local_18 = (nn_list *)(in_RDI + (long)(*(int *)(in_RDI + 0x180) + -1) * 0x18);
  if (in_ESI == 0) {
    pnVar2 = nn_list_next(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    pnVar2 = nn_list_erase(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  if (pnVar2 == (nn_list_item *)0x0) {
    pnVar2 = nn_list_begin(local_18);
  }
  if (pnVar2 == (nn_list_item *)0x0) {
    pnVar2 = (nn_list_item *)0x0;
  }
  else {
    pnVar2 = pnVar2 + -1;
  }
  local_18[1].first = pnVar2;
  while( true ) {
    iVar1 = nn_list_empty(local_18);
    if (iVar1 == 0) {
      return;
    }
    *(int *)(in_RDI + 0x180) = *(int *)(in_RDI + 0x180) + 1;
    if (0x10 < *(int *)(in_RDI + 0x180)) break;
    local_18 = (nn_list *)(in_RDI + (long)(*(int *)(in_RDI + 0x180) + -1) * 0x18);
  }
  *(undefined4 *)(in_RDI + 0x180) = 0xffffffff;
  return;
}

Assistant:

void nn_priolist_advance (struct nn_priolist *self, int release)
{
    struct nn_priolist_slot *slot;
    struct nn_list_item *it;

    nn_assert (self->current > 0);
    slot = &self->slots [self->current - 1];

    /*  Move slot's current pointer to the next pipe. */
    if (release)
        it = nn_list_erase (&slot->pipes, &slot->current->item);
    else
        it = nn_list_next (&slot->pipes, &slot->current->item);
    if (!it)
        it = nn_list_begin (&slot->pipes);
    slot->current = nn_cont (it, struct nn_priolist_data, item);

    /* If there are no more pipes in this slot, find a non-empty slot with
       lower priority. */
    while (nn_list_empty (&slot->pipes)) {
        ++self->current;
        if (self->current > NN_PRIOLIST_SLOTS) {
            self->current = -1;
            return;
        }
        slot = &self->slots [self->current - 1];
    }
}